

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.h
# Opt level: O3

void __thiscall compose::TreeNode::TreeNode(TreeNode *this,string *name)

{
  (this->super_INode).name_._M_dataplus._M_p = (pointer)&(this->super_INode).name_.field_2;
  (this->super_INode).name_._M_string_length = 0;
  (this->super_INode).name_.field_2._M_local_buf[0] = '\0';
  (this->super_INode)._vptr_INode = (_func_int **)&PTR_AddNode_00129898;
  (this->nodes_).
  super__Vector_base<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&(this->super_INode).name_);
  return;
}

Assistant:

TreeNode::TreeNode(const std::string& name) {
    name_ = name;
}